

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_4::Validator::EndIfExpr(Validator *this,IfExpr *expr)

{
  Result RVar1;
  Location *loc;
  
  loc = &(expr->true_).end_loc;
  if ((expr->false_).size_ != 0) {
    loc = &expr->false_end_loc;
  }
  RVar1 = SharedValidator::OnEnd(&this->validator_,loc);
  (this->result_).enum_ = (uint)(RVar1.enum_ == Error || (this->result_).enum_ == Error);
  return (Result)Ok;
}

Assistant:

Result Validator::EndIfExpr(IfExpr* expr) {
  result_ |= validator_.OnEnd(expr->false_.empty() ? expr->true_.end_loc
                                                   : expr->false_end_loc);
  return Result::Ok;
}